

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendVariable
          (VisibilityGroup *this,string *group,IncompleteText nextIfMaxIsInteger,
          IncompleteText nextIfMaxIsFraction)

{
  size_type sVar1;
  long lVar2;
  optional<metaf::Distance> v;
  optional<metaf::Distance> min;
  optional<metaf::Distance> max;
  
  sVar1 = std::__cxx11::string::find((char)group,0x56);
  if ((1 < sVar1 + 1) && (sVar1 != group->_M_string_length)) {
    lVar2 = std::__cxx11::string::find((char)group,0x2f);
    std::__cxx11::string::substr((ulong)&v,(ulong)group);
    Distance::fromMileString(&min,(string *)&v,true);
    std::__cxx11::string::~string((string *)&v);
    if (min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged != false) {
      std::__cxx11::string::substr((ulong)&v,(ulong)group);
      Distance::fromMileString(&max,(string *)&v,true);
      std::__cxx11::string::~string((string *)&v);
      if ((max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_engaged != false) &&
         ((((this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == false &&
           (1 < (this->vis).distModifier - DISTANT)) ||
          (Distance::fromIntegerAndFraction(&v,&this->vis,(Distance *)&min),
          min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier =
               v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier,
          min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload =
               v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload,
          min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_payload._8_4_ =
               v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._8_4_,
          min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit =
               v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit,
          v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_engaged == true)))) {
        (this->vis).distModifier =
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier;
        (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
             super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        *(undefined4 *)
         &(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged =
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._8_4_;
        (this->vis).distUnit =
             min.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit;
        (this->visMax).distModifier =
             max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._0_4_;
        (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)
             max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._4_4_;
        *(undefined8 *)
         &(this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged =
             max.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._8_8_;
        makeVariable(this);
        if (lVar2 == -1) {
          nextIfMaxIsFraction = nextIfMaxIsInteger;
        }
        this->incompleteText = nextIfMaxIsFraction;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool VisibilityGroup::appendVariable(const std::string & group,
	IncompleteText nextIfMaxIsInteger,
	IncompleteText nextIfMaxIsFraction)
{
	const auto vPos = group.find('V');
	if (vPos == std::string::npos || 
		!vPos ||
		vPos == group.length()) return false;
	const bool maxInteger = (group.find('/', vPos) == std::string::npos);
	const auto min = 
		Distance::fromMileString(group.substr(0, vPos), true);
	if (!min.has_value()) return false;
	const auto max = 
		Distance::fromMileString(group.substr(vPos + 1), true);
	if (!max.has_value()) return false;

	if (vis.isReported()) {
		const auto v = Distance::fromIntegerAndFraction(vis, std::move(*min));
		if (!v.has_value()) return false;
		vis = std::move(*v);
	} else {
		vis = std::move(*min);
	}
	visMax = std::move(*max);
	makeVariable();
	incompleteText = maxInteger ? nextIfMaxIsInteger : nextIfMaxIsFraction;
	return true;
}